

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-dt-erector.cpp
# Opt level: O2

Up __thiscall
yactfr::internal::PseudoDtErector::_pseudoDtFromArrayType
          (PseudoDtErector *this,JsonObjVal *jsonDt,string *type,Up *attrs)

{
  JsonObjVal *jsonDt_00;
  bool bVar1;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> *this_00;
  undefined8 *in_R8;
  allocator local_89;
  JsonObjVal *local_88;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_80;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_78 [5];
  string local_50;
  
  local_88 = jsonDt;
  std::__cxx11::string::string((string *)&local_50,"minimum-alignment",&local_89);
  JsonObjVal::
  getRawVal<yactfr::internal::JsonScalarVal<unsigned_long_long,(yactfr::internal::JsonValKind)3>>
            ((JsonObjVal *)type,&local_50,1);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)attrs
                          ,"static-length-array");
  jsonDt_00 = local_88;
  if (bVar1) {
    local_78[0]._M_head_impl = (MapItem *)*in_R8;
    this_00 = local_78;
    *in_R8 = 0;
    _pseudoDtFromSlArrayType(this,local_88,(Up *)type,(uint)this_00);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            attrs,"dynamic-length-array");
    if (!bVar1) {
      __assert_fail("type == strs::dlArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/json/pseudo-dt-erector.cpp"
                    ,0x1c2,
                    "PseudoDt::Up yactfr::internal::PseudoDtErector::_pseudoDtFromArrayType(const JsonObjVal &, const std::string &, MapItem::Up)"
                   );
    }
    local_80._M_head_impl = (MapItem *)*in_R8;
    this_00 = &local_80;
    *in_R8 = 0;
    _pseudoDtFromDlArrayType(this,jsonDt_00,(Up *)type,(uint)this_00);
  }
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             this_00);
  return (__uniq_ptr_data<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>,_true,_true>
          )(__uniq_ptr_data<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>,_true,_true>
            )this;
}

Assistant:

PseudoDt::Up PseudoDtErector::_pseudoDtFromArrayType(const JsonObjVal& jsonDt,
                                                     const std::string& type,
                                                     MapItem::Up attrs)
{
    // minimum alignment
    const auto minAlign = jsonDt.getRawVal(strs::minAlign, 1ULL);

    try {
        if (type == strs::slArray) {
            return this->_pseudoDtFromSlArrayType(jsonDt, std::move(attrs), minAlign);
        } else {
            assert(type == strs::dlArray);
            return this->_pseudoDtFromDlArrayType(jsonDt, std::move(attrs), minAlign);
        }
    } catch (TextParseError& exc) {
        appendMsgToTextParseError(exc, "In array type:", jsonDt.loc());
        throw;
    }
}